

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

char * compression_name(int compression)

{
  int local_18;
  wchar_t i;
  int compression_local;
  
  local_18 = 0;
  while( true ) {
    if (compression < 0 || 0x19 < local_18) {
      _i = "??";
      return _i;
    }
    if (compression_methods[local_18].id == compression) break;
    local_18 = local_18 + 1;
  }
  return compression_methods[local_18].name;
}

Assistant:

static const char *
compression_name(const int compression)
{
	static const int num_compression_methods =
		sizeof(compression_methods)/sizeof(compression_methods[0]);
	int i=0;

	while(compression >= 0 && i < num_compression_methods) {
		if (compression_methods[i].id == compression)
			return compression_methods[i].name;
		i++;
	}
	return "??";
}